

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O0

BOOL __thiscall
Js::CrossSiteObject<Js::SpreadArgument>::InitProperty
          (CrossSiteObject<Js::SpreadArgument> *this,PropertyId propertyId,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  Var value_00;
  PropertyValueInfo *info_local;
  PropertyOperationFlags flags_local;
  Var value_local;
  PropertyId propertyId_local;
  CrossSiteObject<Js::SpreadArgument> *this_local;
  
  scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  value_00 = CrossSite::MarshalVar(scriptContext,value,false);
  BVar1 = SpreadArgument::InitProperty(&this->super_SpreadArgument,propertyId,value_00,flags,info);
  return BVar1;
}

Assistant:

BOOL CrossSiteObject<T>::InitProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        value = CrossSite::MarshalVar(this->GetScriptContext(), value);
        return __super::InitProperty(propertyId, value, flags, info);
    }